

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void Prn_gen<Blob<224>>(int nbRn,pfHash hash,vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  code *in_RSI;
  int in_EDI;
  Blob<224> h;
  int i;
  Blob<224> hcopy;
  undefined1 local_54 [12];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  Blob<224> local_34;
  code *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  printf("Generating %i random numbers : \n");
  Blob<224>::Blob(&local_34);
  memset(&local_34,0,0x1c);
  for (local_38 = 0; local_38 < local_4; local_38 = local_38 + 1) {
    Blob<224>::Blob((Blob<224> *)local_54);
    (*local_10)(&local_34,0x1c,0,local_54);
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back
              ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (value_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}